

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::recoverdelaunay(tetgenmesh *this)

{
  int iVar1;
  arraypool *paVar2;
  bool bVar3;
  int iVar4;
  arraypool *paVar5;
  double dVar6;
  uint local_e8;
  int bakmaxflipstarsize;
  int j;
  int i;
  flipconstraints fc;
  point *ppt;
  badface *parybface;
  badface *bface;
  triface *parytet;
  triface neightet;
  triface tetloop;
  arraypool *swapqueue;
  arraypool *nextflipqueue;
  arraypool *flipqueue;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&parytet);
  flipconstraints::flipconstraints((flipconstraints *)&j);
  if (this->b->quiet == 0) {
    printf("Recovering Delaunayness...\n");
  }
  this->tetprism_vol_sum = 0.0;
  memorypool::traversalinit(this->tetrahedrons);
  neightet._8_8_ = tetrahedrontraverse(this);
  while (neightet._8_8_ != 0) {
    for (tetloop.tet._0_4_ = 0; (int)tetloop.tet < 4; tetloop.tet._0_4_ = (int)tetloop.tet + 1) {
      decode(this,*(tetrahedron *)(neightet._8_8_ + (long)(int)tetloop.tet * 8),(triface *)&parytet)
      ;
      bVar3 = facemarked(this,(triface *)&parytet);
      if (!bVar3) {
        flippush(this,&this->flipstack,(triface *)&neightet.ver);
      }
    }
    fc.remvert = (point)(neightet._8_8_ + 0x20);
    dVar6 = tetprismvol(this,(double *)*fc.remvert,*(double **)(neightet._8_8_ + 0x28),
                        *(double **)(neightet._8_8_ + 0x30),*(double **)(neightet._8_8_ + 0x38));
    this->tetprism_vol_sum = dVar6 + this->tetprism_vol_sum;
    neightet._8_8_ = tetrahedrontraverse(this);
  }
  fc._16_8_ = this->tetprism_vol_sum * this->b->epsilon * 0.001;
  if (this->b->verbose != 0) {
    printf("  Initial obj = %.17g\n",this->tetprism_vol_sum);
  }
  if (1 < this->b->verbose) {
    printf("    Recover Delaunay [Lawson] : %ld\n",this->flippool->items);
  }
  fc.collectnewtets = 1;
  j = 2;
  lawsonflip3d(this,(flipconstraints *)&j);
  if (1 < this->b->verbose) {
    printf("    obj (after Lawson) = %.17g\n",this->tetprism_vol_sum);
  }
  if (this->unflipqueue->objects != 0) {
    fc.enqflag = 1;
    fc.chkencflag = 1;
    j = 0;
    this->autofliplinklevel = 1;
    this->b->fliplinklevel = -1;
    iVar1 = this->b->flipstarsize;
    this->b->flipstarsize = 10;
    paVar5 = (arraypool *)operator_new(0x30);
    arraypool::arraypool(paVar5,0x88,10);
    swapqueue = (arraypool *)operator_new(0x30);
    arraypool::arraypool(swapqueue,0x88,10);
    nextflipqueue = this->unflipqueue;
    this->unflipqueue = paVar5;
    while (paVar2 = nextflipqueue, paVar5 = swapqueue, 0 < nextflipqueue->objects) {
      if (1 < this->b->verbose) {
        printf("    Recover Delaunay [level = %2d] #:  %ld.\n",(ulong)(uint)this->autofliplinklevel,
               nextflipqueue->objects);
      }
      for (bakmaxflipstarsize = 0; (long)bakmaxflipstarsize < nextflipqueue->objects;
          bakmaxflipstarsize = bakmaxflipstarsize + 1) {
        parybface = (badface *)
                    (nextflipqueue->toparray
                     [bakmaxflipstarsize >> ((byte)nextflipqueue->log2objectsperblock & 0x1f)] +
                    (bakmaxflipstarsize & nextflipqueue->objectsperblockmark) *
                    nextflipqueue->objectbytes);
        iVar4 = getedge(this,parybface->forg,parybface->fdest,(triface *)parybface);
        if (iVar4 != 0) {
          iVar4 = removeedgebyflips(this,&parybface->tt,(flipconstraints *)&j);
          if (iVar4 == 2) {
            this->tetprism_vol_sum = fc.bak_tetprism_vol + this->tetprism_vol_sum;
            fc.bak_tetprism_vol = 0.0;
            for (local_e8 = 0; (long)(int)local_e8 < this->cavetetlist->objects;
                local_e8 = local_e8 + 1) {
              bface = (badface *)
                      (this->cavetetlist->toparray
                       [(int)local_e8 >> ((byte)this->cavetetlist->log2objectsperblock & 0x1f)] +
                      (int)((local_e8 & this->cavetetlist->objectsperblockmark) *
                           this->cavetetlist->objectbytes));
              bVar3 = isdeadtet(this,(triface *)bface);
              if (!bVar3) {
                (bface->tt).ver = 0;
                while ((bface->tt).ver < 4) {
                  decode(this,(bface->tt).tet[(bface->tt).ver],(triface *)&parytet);
                  bVar3 = facemarked(this,(triface *)&parytet);
                  if (!bVar3) {
                    flippush(this,&this->flipstack,&bface->tt);
                  }
                  (bface->tt).ver = (bface->tt).ver + 1;
                }
              }
            }
            arraypool::restart(this->cavetetlist);
            j = 2;
            lawsonflip3d(this,(flipconstraints *)&j);
            j = 0;
            for (local_e8 = 0; (long)(int)local_e8 < this->unflipqueue->objects;
                local_e8 = local_e8 + 1) {
              parybface = (badface *)
                          (this->unflipqueue->toparray
                           [(int)local_e8 >> ((byte)this->unflipqueue->log2objectsperblock & 0x1f)]
                          + (int)((local_e8 & this->unflipqueue->objectsperblockmark) *
                                 this->unflipqueue->objectbytes));
              arraypool::newindex(nextflipqueue,&ppt);
              badface::operator=((badface *)ppt,parybface);
            }
            arraypool::restart(this->unflipqueue);
          }
          else {
            arraypool::newindex(swapqueue,&ppt);
            badface::operator=((badface *)ppt,parybface);
            fc.bak_tetprism_vol = 0.0;
          }
        }
      }
      if (1 < this->b->verbose) {
        printf("    obj (after level %d) = %.17g.\n",this->tetprism_vol_sum,
               (ulong)(uint)this->autofliplinklevel);
      }
      arraypool::restart(nextflipqueue);
      nextflipqueue = swapqueue;
      swapqueue = paVar2;
      if (0 < paVar5->objects) {
        if (this->b->delmaxfliplevel <= this->autofliplinklevel) break;
        this->autofliplinklevel = this->b->fliplinklevelinc + this->autofliplinklevel;
      }
    }
    if ((0 < nextflipqueue->objects) && (1 < this->b->verbose)) {
      printf("    %ld non-Delaunay edges remained.\n",nextflipqueue->objects);
    }
    if (this->b->verbose != 0) {
      printf("  Final obj  = %.17g\n",this->tetprism_vol_sum);
    }
    this->b->flipstarsize = iVar1;
    if (nextflipqueue != (arraypool *)0x0) {
      arraypool::~arraypool(nextflipqueue);
      operator_delete(nextflipqueue,0x30);
    }
    if (swapqueue != (arraypool *)0x0) {
      arraypool::~arraypool(swapqueue);
      operator_delete(swapqueue,0x30);
    }
  }
  return;
}

Assistant:

void tetgenmesh::recoverdelaunay()
{
  arraypool *flipqueue, *nextflipqueue, *swapqueue;
  triface tetloop, neightet, *parytet;
  badface *bface, *parybface;
  point *ppt;
  flipconstraints fc;
  int i, j;

  if (!b->quiet) {
    printf("Recovering Delaunayness...\n");
  }

  tetprism_vol_sum = 0.0; // Initialize it.

  // Put all interior faces of the mesh into 'flipstack'.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != NULL) {
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      decode(tetloop.tet[tetloop.ver], neightet);
      if (!facemarked(neightet)) {
        flippush(flipstack, &tetloop);
      }
    }
    ppt = (point *) &(tetloop.tet[4]);
    tetprism_vol_sum += tetprismvol(ppt[0], ppt[1], ppt[2], ppt[3]);
    tetloop.tet = tetrahedrontraverse();
  }

  // Calulate a relatively lower bound for small improvement. 
  //   Used to avoid rounding error in volume calculation.
  fc.bak_tetprism_vol = tetprism_vol_sum * b->epsilon * 1e-3;

  if (b->verbose) {
    printf("  Initial obj = %.17g\n", tetprism_vol_sum);
  }

  if (b->verbose > 1) {
    printf("    Recover Delaunay [Lawson] : %ld\n", flippool->items);
  }

  // First only use the basic Lawson's flip.
  fc.remove_ndelaunay_edge = 1;
  fc.enqflag = 2;

  lawsonflip3d(&fc);

  if (b->verbose > 1) {
    printf("    obj (after Lawson) = %.17g\n", tetprism_vol_sum);
  }

  if (unflipqueue->objects == 0l) {
    return; // The mesh is Delaunay.
  }

  fc.unflip = 1; // Unflip if the edge is not flipped.
  fc.collectnewtets = 1; // new tets are returned in 'cavetetlist'.
  fc.enqflag = 0;

  autofliplinklevel = 1; // Init level.
  b->fliplinklevel = -1; // No fixed level.

  // For efficiency reason, we limit the maximium size of the edge star.
  int bakmaxflipstarsize = b->flipstarsize;
  b->flipstarsize = 10; // default

  flipqueue = new arraypool(sizeof(badface), 10);
  nextflipqueue = new arraypool(sizeof(badface), 10);
  
  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  while (flipqueue->objects > 0l) {

    if (b->verbose > 1) {
      printf("    Recover Delaunay [level = %2d] #:  %ld.\n",
             autofliplinklevel, flipqueue->objects);
    }

    for (i = 0; i < flipqueue->objects; i++) {
      bface  = (badface *) fastlookup(flipqueue, i);
      if (getedge(bface->forg, bface->fdest, &bface->tt)) {
        if (removeedgebyflips(&(bface->tt), &fc) == 2) {
          tetprism_vol_sum += fc.tetprism_vol_sum;
          fc.tetprism_vol_sum = 0.0; // Clear it.
          // Queue new faces for flips.
          for (j = 0; j < cavetetlist->objects; j++) {
            parytet = (triface *) fastlookup(cavetetlist, j);
            // A queued new tet may be dead.
            if (!isdeadtet(*parytet)) {
              for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
                // Avoid queue a face twice.
                decode(parytet->tet[parytet->ver], neightet);
                if (!facemarked(neightet)) {
                  flippush(flipstack, parytet);
                }
              } // parytet->ver
            }
          } // j
          cavetetlist->restart();
          // Remove locally non-Delaunay faces. New non-Delaunay edges
          //   may be found. They are saved in 'unflipqueue'.
          fc.enqflag = 2;
          lawsonflip3d(&fc);
          fc.enqflag = 0;
          // There may be unflipable faces. Add them in flipqueue.
          for (j = 0; j < unflipqueue->objects; j++) {
            bface  = (badface *) fastlookup(unflipqueue, j);
            flipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          }
          unflipqueue->restart();
        } else {
          // Unable to remove this edge. Save it.
          nextflipqueue->newindex((void **) &parybface);
          *parybface = *bface;
          // Normally, it should be zero. 
          //assert(fc.tetprism_vol_sum == 0.0);
          // However, due to rounding errors, a tiny value may appear.
          fc.tetprism_vol_sum = 0.0;
        }
      }
    } // i

    if (b->verbose > 1) {
      printf("    obj (after level %d) = %.17g.\n", autofliplinklevel,
             tetprism_vol_sum);
    }
    flipqueue->restart();

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = nextflipqueue;
    nextflipqueue = swapqueue;

    if (flipqueue->objects > 0l) {
      // default 'b->delmaxfliplevel' is 1.
      if (autofliplinklevel >= b->delmaxfliplevel) {
        // For efficiency reason, we do not search too far.
        break;
      }
      autofliplinklevel+=b->fliplinklevelinc;
    }
  } // while (flipqueue->objects > 0l)

  if (flipqueue->objects > 0l) {
    if (b->verbose > 1) {
      printf("    %ld non-Delaunay edges remained.\n", flipqueue->objects);
    }
  }

  if (b->verbose) {
    printf("  Final obj  = %.17g\n", tetprism_vol_sum);
  }

  b->flipstarsize = bakmaxflipstarsize;
  delete flipqueue;
  delete nextflipqueue;
}